

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O0

void __thiscall cppcms::rpc::json_call::json_call(json_call *this,context *c)

{
  bool bVar1;
  json_type jVar2;
  char *pcVar3;
  undefined8 uVar4;
  noncopyable *__x;
  value *path;
  ulong uVar5;
  noncopyable *in_RDI;
  value request;
  istringstream ss;
  pair<void_*,_unsigned_long> post_data;
  string subtype;
  string type;
  content_type ct;
  request *in_stack_fffffffffffffb88;
  request *in_stack_fffffffffffffb90;
  request *in_stack_fffffffffffffb98;
  undefined1 full;
  istream *in_stack_fffffffffffffba0;
  allocator *this_00;
  value *in_stack_fffffffffffffba8;
  string local_360 [16];
  string *in_stack_fffffffffffffcb0;
  value *in_stack_fffffffffffffcb8;
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [47];
  allocator local_291;
  string local_290 [32];
  istringstream local_270 [384];
  pair<void_*,_unsigned_long> local_f0;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [38];
  undefined1 local_92;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [80];
  
  booster::noncopyable::noncopyable(in_RDI);
  std::shared_ptr<cppcms::http::context>::shared_ptr((shared_ptr<cppcms::http::context> *)0x44ad54);
  json::value::value((value *)0x44ad6d);
  std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::vector
            ((vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)0x44ad88);
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  booster::hold_ptr<cppcms::rpc::json_call::_data>::hold_ptr
            ((hold_ptr<cppcms::rpc::json_call::_data> *)(in_RDI + 0x58));
  http::context::request((context *)0x44adc9);
  http::request::content_type_parsed(in_stack_fffffffffffffb98);
  http::content_type::type_abi_cxx11_((content_type *)in_stack_fffffffffffffb98);
  http::content_type::subtype_abi_cxx11_((content_type *)in_stack_fffffffffffffb98);
  full = (undefined1)((ulong)in_stack_fffffffffffffb98 >> 0x38);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
  if ((bVar1) ||
     (((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88), bVar1
       && (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88),
          bVar1)) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88), bVar1))
     )) {
    local_92 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Invalid content type",&local_91);
    call_error::call_error
              ((call_error *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88);
    local_92 = 0;
    __cxa_throw(uVar4,&call_error::typeinfo,call_error::~call_error);
  }
  http::context::request((context *)0x44b05e);
  http::request::request_method_abi_cxx11_(in_stack_fffffffffffffb88);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
  std::__cxx11::string::~string(local_b8);
  if (bVar1) {
    local_da = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Invalid request method",&local_d9);
    call_error::call_error
              ((call_error *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88);
    local_da = 0;
    __cxa_throw(uVar4,&call_error::typeinfo,call_error::~call_error);
  }
  http::context::request((context *)0x44b1da);
  local_f0 = http::request::raw_post_data(in_stack_fffffffffffffb90);
  uVar5 = local_f0.second;
  pcVar3 = (char *)local_f0.first;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,pcVar3,uVar5,&local_291);
  std::__cxx11::istringstream::istringstream(local_270,local_290,_S_in);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  json::value::value((value *)0x44b2bc);
  bVar1 = json::value::load(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0,(bool)full,
                            (int *)in_stack_fffffffffffffb90);
  if (bVar1) {
    jVar2 = json::value::type((value *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88);
    if (jVar2 == is_string) {
      jVar2 = json::value::type((value *)in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88
                               );
      if (jVar2 == is_array) {
        jVar2 = json::value::type((value *)in_stack_fffffffffffffb90,
                                  (char *)in_stack_fffffffffffffb88);
        if (jVar2 != is_undefined) {
          jVar2 = json::value::type((value *)in_stack_fffffffffffffb90,
                                    (char *)in_stack_fffffffffffffb88);
          if (jVar2 == is_null) {
            in_RDI[0x50] = (noncopyable)0x1;
          }
          else {
            in_RDI[0x50] = (noncopyable)0x0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_310,"id",&local_311);
            json::value::operator[](in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
            json::value::swap((value *)in_stack_fffffffffffffb90,(value *)in_stack_fffffffffffffb88)
            ;
            std::__cxx11::string::~string(local_310);
            std::allocator<char>::~allocator((allocator<char> *)&local_311);
          }
          __x = in_RDI + 0x18;
          this_00 = &local_339;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_338,"params",this_00);
          path = json::value::operator[](in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
          json::value::array((value *)0x44b6fc);
          std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>::swap
                    ((vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)this_00,
                     (vector<cppcms::json::value,_std::allocator<cppcms::json::value>_> *)__x);
          std::__cxx11::string::~string(local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
          json::value::get<std::__cxx11::string>((value *)__x,(char *)path);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x30),local_360);
          std::__cxx11::string::~string(local_360);
          json::value::~value((value *)0x44b77b);
          std::__cxx11::istringstream::~istringstream(local_270);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::~string(local_50);
          http::content_type::~content_type((content_type *)0x44b7af);
          return;
        }
      }
    }
    local_2ea = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"Invalid JSON-RPC",&local_2e9);
    call_error::call_error
              ((call_error *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88);
    local_2ea = 0;
    __cxa_throw(uVar4,&call_error::typeinfo,call_error::~call_error);
  }
  local_2c2 = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"Invalid JSON",&local_2c1);
  call_error::call_error
            ((call_error *)in_stack_fffffffffffffb90,(string *)in_stack_fffffffffffffb88);
  local_2c2 = 0;
  __cxa_throw(uVar4,&call_error::typeinfo,call_error::~call_error);
}

Assistant:

json_call::json_call(http::context &c) 
	{
		http::content_type ct = c.request().content_type_parsed();
		std::string type = ct.type();
		std::string subtype = ct.subtype();
		if(type != "application" || (subtype!="json" && subtype!="jsonrequest" && subtype!="json-rpc"))
			throw call_error("Invalid content type"); 
		if(c.request().request_method()!="POST")
			throw call_error("Invalid request method"); 
		std::pair<void *,size_t> post_data = c.request().raw_post_data();
		std::istringstream ss(std::string(reinterpret_cast<char const *>(post_data.first),post_data.second));
		json::value request;
		if(!request.load(ss,true))
			throw call_error("Invalid JSON");
		if(	request.type("method")!=json::is_string 
			|| request.type("params")!=json::is_array
			|| request.type("id")==json::is_undefined)
		{
			throw call_error("Invalid JSON-RPC");
		}
		if(request.type("id")==json::is_null) {
			notification_ = true;
		}
		else {
			notification_ = false;
			id_.swap(request["id"]);
		}
		params_.swap(request["params"].array());
		method_ = request.get<std::string>("method");
	}